

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::on_string
          (tag_no_value_t<cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  undefined4 uVar1;
  undefined4 uVar2;
  logic_error *this_00;
  storage_type *psVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  qstring_wrapper_t local_228;
  string local_208;
  QArrayData *local_1e8;
  char16_t *local_1e0;
  QArrayData QStack_1d8;
  char *local_1c8 [2];
  char local_1b8 [16];
  qstring_wrapper_t local_1a8;
  qstring_wrapper_t local_190;
  string local_178;
  string local_158;
  string_t local_138;
  string_t local_120;
  string_t local_108;
  string_t local_f0;
  qstring_wrapper_t local_d8;
  qstring_wrapper_t local_c0;
  qstring_wrapper_t local_a8;
  qstring_wrapper_t local_90;
  qstring_wrapper_t local_78;
  qstring_wrapper_t local_60;
  qstring_wrapper_t local_48;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Tag \"","");
  if (local_1c8[0] == (char *)0x0) {
    psVar3 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)strlen(local_1c8[0]);
  }
  QVar4.m_data = psVar3;
  QVar4.m_size = (qsizetype)&local_1e8;
  QString::fromUtf8(QVar4);
  local_190.m_str.d.d = (Data *)local_1e8;
  local_190.m_str.d.ptr = local_1e0;
  local_190.m_str.d.size._0_4_ = QStack_1d8.ref_._q_value.super___atomic_base<int>._M_i;
  local_190.m_str.d.size._4_4_ = QStack_1d8.flags.i;
  if (local_1e8 != (QArrayData *)0x0) {
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8,2,8);
    }
  }
  operator+(&local_d8,&local_190,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  local_1e8 = &QStack_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"\" doesn\'t allow any values. But we\'ve got this: \"","");
  if (local_1e8 == (QArrayData *)0x0) {
    psVar3 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)strlen((char *)local_1e8);
  }
  QVar5.m_data = psVar3;
  QVar5.m_size = (qsizetype)&local_208;
  QString::fromUtf8(QVar5);
  local_1a8.m_str.d.d = (Data *)local_208._M_dataplus._M_p;
  local_1a8.m_str.d.ptr = (char16_t *)local_208._M_string_length;
  local_1a8.m_str.d.size = local_208.field_2._M_allocated_capacity;
  if ((QArrayData *)local_208._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_208._M_dataplus._M_p = *(int *)local_208._M_dataplus._M_p + 1;
    UNLOCK();
    LOCK();
    *(int *)local_208._M_dataplus._M_p = *(int *)local_208._M_dataplus._M_p + -1;
    UNLOCK();
    if (*(int *)local_208._M_dataplus._M_p == 0) {
      QArrayData::deallocate((QArrayData *)local_208._M_dataplus._M_p,2,8);
    }
  }
  operator+(&local_c0,&local_d8,&local_1a8);
  operator+(&local_a8,&local_c0,str);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_f0,&local_208);
  operator+(&local_90,&local_a8,&local_f0);
  operator+(&local_78,&local_90,&info->m_file_name);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"\" on line ","");
  qstring_trait_t::from_ascii(&local_108,&local_158);
  operator+(&local_60,&local_78,&local_108);
  qstring_trait_t::to_string(&local_120,info->m_line_number);
  operator+(&local_48,&local_60,&local_120);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,".","");
  qstring_trait_t::from_ascii(&local_138,&local_178);
  operator+(&local_228,&local_48,&local_138);
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__exception_t_00121a28;
  uVar1 = local_228.m_str.d.d._0_4_;
  uVar2 = local_228.m_str.d.d._4_4_;
  local_228.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar1;
  *(undefined4 *)(this_00 + 0x14) = uVar2;
  *(undefined4 *)(this_00 + 0x18) = local_228.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_228.m_str.d.ptr._4_4_;
  local_228.m_str.d.ptr = (char16_t *)0x0;
  *(qsizetype *)(this_00 + 0x20) = local_228.m_str.d.size;
  local_228.m_str.d.size = 0;
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}